

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::addFieldHandlerImpl(JsonCodec *this,Field field,Type type,HandlerBase *handler)

{
  Field key;
  bool bVar1;
  Impl *pIVar2;
  anon_class_1_0_00000001 local_91;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  Fault local_40;
  Fault f;
  HandlerBase *handler_local;
  JsonCodec *this_local;
  Type type_local;
  
  type_local._0_8_ = type.field_4;
  this_local = type._0_8_;
  _f = StructSchema::Field::getType(&field);
  bVar1 = capnp::Type::operator==((Type *)&this_local,(Type *)&f);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[60]>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x36b,FAILED,"type == field.getType()",
               "\"handler type did not match field type for addFieldHandler()\"",
               (char (*) [60])"handler type did not match field type for addFieldHandler()");
    kj::_::Debug::Fault::fatal(&local_40);
  }
  pIVar2 = kj::Own<capnp::JsonCodec::Impl>::operator->(&this->impl);
  memcpy(&local_90,&field,0x40);
  key._8_8_ = uStack_88;
  key.parent.super_Schema.raw = (Schema)(Schema)local_90;
  key.proto._reader.segment = (SegmentReader *)local_80;
  key.proto._reader.capTable = (CapTableReader *)uStack_78;
  key.proto._reader.data = (void *)local_70;
  key.proto._reader.pointers = (WirePointer *)uStack_68;
  key.proto._reader.dataSize = (undefined4)local_60;
  key.proto._reader.pointerCount = local_60._4_2_;
  key.proto._reader._38_2_ = local_60._6_2_;
  key.proto._reader._40_8_ = uStack_58;
  kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::
  upsert<capnp::JsonCodec::addFieldHandlerImpl(capnp::StructSchema::Field,capnp::Type,capnp::JsonCodec::HandlerBase&)::__0>
            ((HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*> *)
             &pIVar2->fieldHandlers,key,handler,&local_91);
  return;
}

Assistant:

void JsonCodec::addFieldHandlerImpl(StructSchema::Field field, Type type, HandlerBase& handler) {
  KJ_REQUIRE(type == field.getType(),
      "handler type did not match field type for addFieldHandler()");
  impl->fieldHandlers.upsert(field, &handler, [](HandlerBase*& existing, HandlerBase* replacement) {
    KJ_REQUIRE(existing == replacement, "field already has a different registered handler");
  });
}